

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O3

JL_STATUS OutputNumberObject(JlDataObject *NumberObject,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  JL_NUM_TYPE JVar1;
  JL_STATUS JVar2;
  size_t DataSize;
  char *__format;
  uint64_t numU64;
  char numString [64];
  double local_70;
  char local_68 [72];
  
  local_68[0x30] = '\0';
  local_68[0x31] = '\0';
  local_68[0x32] = '\0';
  local_68[0x33] = '\0';
  local_68[0x34] = '\0';
  local_68[0x35] = '\0';
  local_68[0x36] = '\0';
  local_68[0x37] = '\0';
  local_68[0x38] = '\0';
  local_68[0x39] = '\0';
  local_68[0x3a] = '\0';
  local_68[0x3b] = '\0';
  local_68[0x3c] = '\0';
  local_68[0x3d] = '\0';
  local_68[0x3e] = '\0';
  local_68[0x3f] = '\0';
  local_68[0x20] = '\0';
  local_68[0x21] = '\0';
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x2e] = '\0';
  local_68[0x2f] = '\0';
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  JVar1 = JlGetObjectNumberType(NumberObject);
  if (JVar1 == JL_NUM_TYPE_FLOAT) {
    local_70 = 0.0;
    JVar2 = JlGetObjectNumberF64(NumberObject,&local_70);
    if (JVar2 == JL_STATUS_SUCCESS) {
      sprintf(local_68,"%.16g",SUB84(local_70,0));
    }
  }
  else {
    if (JVar1 == JL_NUM_TYPE_SIGNED) {
      local_70 = 0.0;
      JVar2 = JlGetObjectNumberS64(NumberObject,(int64_t *)&local_70);
      if (JVar2 != JL_STATUS_SUCCESS) goto LAB_001026f4;
      __format = "%ld";
    }
    else {
      if (JVar1 != JL_NUM_TYPE_UNSIGNED) {
        return JL_STATUS_WRONG_TYPE;
      }
      local_70 = 0.0;
      JVar2 = JlGetObjectNumberU64(NumberObject,(uint64_t *)&local_70);
      if (JVar2 != JL_STATUS_SUCCESS) goto LAB_001026f4;
      if (((OutputFlags & 0x20) == 0) ||
         (JVar1 = JlIsObjectNumberHex(NumberObject), JVar1 == JL_NUM_TYPE_NONE)) {
        __format = "%lu";
      }
      else if ((ulong)local_70 < 0x100) {
        __format = "0x%2.2lx";
      }
      else if ((ulong)local_70 < 0x10000) {
        __format = "0x%4.4lx";
      }
      else if ((ulong)local_70 >> 0x20 == 0) {
        __format = "0x%8.8lx";
      }
      else {
        __format = "0x%16.16lx";
      }
    }
    sprintf(local_68,__format,local_70);
  }
LAB_001026f4:
  if (JVar2 == JL_STATUS_SUCCESS) {
    DataSize = strlen(local_68);
    JVar2 = JlBufferAdd(JsonBuffer,local_68,DataSize);
  }
  return JVar2;
}

Assistant:

JL_STATUS
    OutputNumberObject
    (
        JlDataObject const*     NumberObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    char numString [64] = "";

    JL_NUM_TYPE numType = JlGetObjectNumberType( NumberObject );
    if( JL_NUM_TYPE_UNSIGNED == numType )
    {
        uint64_t numU64 = 0;
        jlStatus = JlGetObjectNumberU64( NumberObject, &numU64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            if(     OutputFlags & JL_OUTPUT_FLAGS_J5_ALLOW_HEX
                &&  JlIsObjectNumberHex( NumberObject ) )
            {
                // Format hex as 2 digits, 4 digits, 8 digits, or 16 digits depending on value
                if     ( numU64 <= 0xff )       { sprintf( numString, "0x%2.2"PRIx64, numU64 ); }
                else if( numU64 <= 0xffff )     { sprintf( numString, "0x%4.4"PRIx64, numU64 ); }
                else if( numU64 <= 0xffffffff ) { sprintf( numString, "0x%8.8"PRIx64, numU64 ); }
                else                            { sprintf( numString, "0x%16.16"PRIx64, numU64 ); }
            }
            else
            {
                sprintf( numString, "%"PRIu64, numU64 );
            }
        }
    }
    else if( JL_NUM_TYPE_SIGNED == numType )
    {
        int64_t numS64 = 0;
        jlStatus = JlGetObjectNumberS64( NumberObject, &numS64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            sprintf( numString, "%"PRId64, numS64 );
        }
    }
    else if( JL_NUM_TYPE_FLOAT == numType )
    {
        // Now try getting as a double
        double numF64 = 0.0;
        jlStatus = JlGetObjectNumberF64( NumberObject, &numF64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Note: Output is printing using %.16g which gives the best compromise between precision and sensibly
            // printing out most numbers. While %.17g would give full precision it will cause simple numbers such
            // as 2.1 to print as 2.1000000000000001 due to the limitations of the floating point format.
            sprintf( numString, "%.16g", numF64 );
        }
    }
    else
    {
        jlStatus = JL_STATUS_WRONG_TYPE;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        jlStatus = JlBufferAdd( JsonBuffer, numString, strlen(numString) );
    }

    return jlStatus;
}